

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportBuildFileGenerator::GenerateImportCxxModuleConfigTargetInclusion
          (cmExportBuildFileGenerator *this,string *config)

{
  cmGeneratorTarget *this_00;
  ostream *poVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  string fileName;
  string local_470;
  string se;
  string cxx_modules_dirname;
  ostringstream e;
  cmGeneratedFileStream os;
  
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x15])
            (&cxx_modules_dirname,this);
  if (cxx_modules_dirname._M_string_length == 0) {
    bVar3 = true;
  }
  else {
    if (config->_M_string_length == 0) {
      std::__cxx11::string::assign((char *)config);
    }
    os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         (this->super_cmExportFileGenerator).FileDir._M_dataplus._M_p;
    os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)(this->super_cmExportFileGenerator).FileDir._M_string_length;
    _e = (pointer)0x1;
    cmStrCat<std::__cxx11::string,char[14],std::__cxx11::string,char[7]>
              (&fileName,(cmAlphaNum *)&os,(cmAlphaNum *)&e,&cxx_modules_dirname,
               (char (*) [14])0x5c1171,config,(char (*) [7])0x59b26f);
    cmGeneratedFileStream::cmGeneratedFileStream(&os,&fileName,true,None);
    bVar3 = ((&os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [(long)os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream[-3]] & 5) == 0;
    if (bVar3) {
      cmGeneratedFileStream::SetCopyIfDifferent(&os,true);
      for (p_Var2 = (this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 !=
          &(this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.super__Rb_tree_header;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
        this_00 = *(cmGeneratorTarget **)(p_Var2 + 1);
        poVar1 = std::operator<<((ostream *)&os,"include(\"${CMAKE_CURRENT_LIST_DIR}/target-");
        cmGeneratorTarget::GetExportName_abi_cxx11_((string *)&e,this_00);
        poVar1 = std::operator<<(poVar1,(string *)&e);
        poVar1 = std::operator<<(poVar1,'-');
        poVar1 = std::operator<<(poVar1,(string *)config);
        std::operator<<(poVar1,".cmake\")\n");
        std::__cxx11::string::~string((string *)&e);
      }
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar1 = std::operator<<((ostream *)&e,"cannot write to file \"");
      poVar1 = std::operator<<(poVar1,(string *)&fileName);
      poVar1 = std::operator<<(poVar1,"\": ");
      std::operator<<(poVar1,(string *)&se);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::__cxx11::string::~string((string *)&se);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&os);
    std::__cxx11::string::~string((string *)&fileName);
  }
  std::__cxx11::string::~string((string *)&cxx_modules_dirname);
  return bVar3;
}

Assistant:

bool cmExportBuildFileGenerator::GenerateImportCxxModuleConfigTargetInclusion(
  std::string config) const
{
  auto cxx_modules_dirname = this->GetCxxModulesDirectory();
  if (cxx_modules_dirname.empty()) {
    return true;
  }

  if (config.empty()) {
    config = "noconfig";
  }

  std::string fileName = cmStrCat(this->FileDir, '/', cxx_modules_dirname,
                                  "/cxx-modules-", config, ".cmake");

  cmGeneratedFileStream os(fileName, true);
  if (!os) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  os.SetCopyIfDifferent(true);

  for (auto const* tgt : this->ExportedTargets) {
    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/target-" << tgt->GetExportName()
       << '-' << config << ".cmake\")\n";
  }

  return true;
}